

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

void botpDT(char *otp,size_t digit,octet *mac,size_t mac_len)

{
  long lVar1;
  long in_RCX;
  long in_RDX;
  size_t in_RSI;
  char *in_RDI;
  size_t offset;
  u32 pwd;
  
  lVar1 = (long)(int)(*(byte *)(in_RDX + in_RCX + -1) & 0xf);
  decFromU32(in_RDI,in_RSI,
             (CONCAT31(CONCAT21(CONCAT11(*(undefined1 *)(in_RDX + lVar1),
                                         *(undefined1 *)(in_RDX + 1 + lVar1)),
                                *(undefined1 *)(in_RDX + 2 + lVar1)),
                       *(undefined1 *)(in_RDX + 3 + lVar1)) & 0x7fffffff) % powers_of_10[in_RSI]);
  return;
}

Assistant:

void botpDT(char* otp, size_t digit, const octet mac[], size_t mac_len)
{
	register u32 pwd;
	register size_t offset;
	ASSERT(mac_len >= 20);
	ASSERT(4 <= digit && digit <= 9);
	ASSERT(memIsValid(otp, digit + 1));
	ASSERT(memIsValid(mac, mac_len));
	offset = mac[mac_len - 1] & 15;
	pwd = mac[offset], pwd <<= 8;
	pwd ^= mac[offset + 1], pwd <<= 8;
	pwd ^= mac[offset + 2], pwd <<= 8;
	pwd ^= mac[offset + 3];
	pwd &= 0x7FFFFFFF;
	pwd %= powers_of_10[digit];
	decFromU32(otp, digit, pwd);
	offset = 0;
	pwd = 0;
}